

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodea.c
# Opt level: O0

int CVApolynomialMalloc(CVodeMem cv_mem)

{
  long lVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  long *__ptr;
  long lVar5;
  long in_RDI;
  int allocOK;
  long ii;
  long i;
  CVpolynomialDataMem content;
  CVdtpntMem *dt_mem;
  CVadjMem ca_mem;
  int local_3c;
  long local_38;
  long local_30;
  int local_4;
  
  local_38 = 0;
  local_3c = 1;
  lVar1 = *(long *)(in_RDI + 0xa70);
  uVar4 = N_VClone(*(undefined8 *)(in_RDI + 0x1d0));
  *(undefined8 *)(lVar1 + 0x1f8) = uVar4;
  if (*(long *)(lVar1 + 0x1f8) == 0) {
    local_4 = 0;
  }
  else {
    if (*(int *)(lVar1 + 0xb8) != 0) {
      uVar4 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0x90),*(undefined8 *)(in_RDI + 0x1d0));
      *(undefined8 *)(lVar1 + 0x200) = uVar4;
      if (*(long *)(lVar1 + 0x200) == 0) {
        N_VDestroy(*(undefined8 *)(lVar1 + 0x1f8));
        return 0;
      }
    }
    lVar2 = *(long *)(lVar1 + 0x78);
    for (local_30 = 0; local_30 <= *(long *)(lVar1 + 0x68); local_30 = local_30 + 1) {
      __ptr = (long *)malloc(0x18);
      if (__ptr == (long *)0x0) {
        local_38 = local_30;
        local_3c = 0;
        break;
      }
      lVar5 = N_VClone(*(undefined8 *)(in_RDI + 0x1d0));
      *__ptr = lVar5;
      if (*__ptr == 0) {
        free(__ptr);
        local_38 = local_30;
        local_3c = 0;
        break;
      }
      if (*(int *)(lVar1 + 0xb8) != 0) {
        lVar5 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0x90),*(undefined8 *)(in_RDI + 0x1d0));
        __ptr[1] = lVar5;
        if (__ptr[1] == 0) {
          N_VDestroy(*__ptr);
          free(__ptr);
          local_38 = local_30;
          local_3c = 0;
          break;
        }
      }
      *(long **)(*(long *)(lVar2 + local_30 * 8) + 8) = __ptr;
    }
    if (local_3c == 0) {
      N_VDestroy(*(undefined8 *)(lVar1 + 0x1f8));
      if (*(int *)(lVar1 + 0xb8) != 0) {
        N_VDestroyVectorArray(*(undefined8 *)(lVar1 + 0x200),*(undefined4 *)(in_RDI + 0x90));
      }
      for (local_30 = 0; local_30 < local_38; local_30 = local_30 + 1) {
        puVar3 = *(undefined8 **)(*(long *)(lVar2 + local_30 * 8) + 8);
        N_VDestroy(*puVar3);
        if (*(int *)(lVar1 + 0xb8) != 0) {
          N_VDestroyVectorArray(puVar3[1],*(undefined4 *)(in_RDI + 0x90));
        }
        free(*(void **)(*(long *)(lVar2 + local_30 * 8) + 8));
        *(undefined8 *)(*(long *)(lVar2 + local_30 * 8) + 8) = 0;
      }
    }
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

static sunbooleantype CVApolynomialMalloc(CVodeMem cv_mem)
{
  CVadjMem ca_mem;
  CVdtpntMem* dt_mem;
  CVpolynomialDataMem content;
  long int i, ii = 0;
  sunbooleantype allocOK;

  allocOK = SUNTRUE;

  ca_mem = cv_mem->cv_adj_mem;

  /* Allocate space for the vectors ytmp and yStmp */

  ca_mem->ca_ytmp = N_VClone(cv_mem->cv_tempv);
  if (ca_mem->ca_ytmp == NULL) { return (SUNFALSE); }

  if (ca_mem->ca_IMstoreSensi)
  {
    ca_mem->ca_yStmp = N_VCloneVectorArray(cv_mem->cv_Ns, cv_mem->cv_tempv);
    if (ca_mem->ca_yStmp == NULL)
    {
      N_VDestroy(ca_mem->ca_ytmp);
      return (SUNFALSE);
    }
  }

  /* Allocate space for the content field of the dt structures */

  dt_mem = ca_mem->dt_mem;

  for (i = 0; i <= ca_mem->ca_nsteps; i++)
  {
    content = NULL;
    content = (CVpolynomialDataMem)malloc(sizeof(struct CVpolynomialDataMemRec));
    if (content == NULL)
    {
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    content->y = N_VClone(cv_mem->cv_tempv);
    if (content->y == NULL)
    {
      free(content);
      content = NULL;
      ii      = i;
      allocOK = SUNFALSE;
      break;
    }

    if (ca_mem->ca_IMstoreSensi)
    {
      content->yS = N_VCloneVectorArray(cv_mem->cv_Ns, cv_mem->cv_tempv);
      if (content->yS == NULL)
      {
        N_VDestroy(content->y);
        free(content);
        content = NULL;
        ii      = i;
        allocOK = SUNFALSE;
        break;
      }
    }

    dt_mem[i]->content = content;
  }

  /* If an error occurred, deallocate and return */

  if (!allocOK)
  {
    N_VDestroy(ca_mem->ca_ytmp);

    if (ca_mem->ca_IMstoreSensi)
    {
      N_VDestroyVectorArray(ca_mem->ca_yStmp, cv_mem->cv_Ns);
    }

    for (i = 0; i < ii; i++)
    {
      content = (CVpolynomialDataMem)(dt_mem[i]->content);
      N_VDestroy(content->y);
      if (ca_mem->ca_IMstoreSensi)
      {
        N_VDestroyVectorArray(content->yS, cv_mem->cv_Ns);
      }
      free(dt_mem[i]->content);
      dt_mem[i]->content = NULL;
    }
  }

  return (allocOK);
}